

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

LY_ERR lyd_validate_new(lyd_node **first,lysc_node *sparent,lys_module *mod,lysc_ext_instance *ext,
                       uint32_t val_opts,uint32_t int_opts,ly_ht *getnext_ht,lyd_node **diff)

{
  uint16_t uVar1;
  lysc_node *plVar2;
  ly_ht *ht;
  ly_ctx *ctx;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ly_ctx *plVar6;
  ly_bool lVar7;
  ly_bool lVar8;
  LY_ERR LVar9;
  LY_ERR LVar10;
  lys_module *plVar11;
  lyd_node *last;
  lysc_node *plVar12;
  ly_bool lVar13;
  lys_module *plVar14;
  lysc_node *local_50;
  lyd_node *node;
  uint local_3c;
  undefined8 local_38;
  
  if ((first == (lyd_node **)0x0) || (sparent == (lysc_node *)0x0 && mod == (lys_module *)0x0)) {
    __assert_fail("first && (sparent || mod)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0x3af,
                  "LY_ERR lyd_validate_new(struct lyd_node **, const struct lysc_node *, const struct lys_module *, const struct lysc_ext_instance *, uint32_t, uint32_t, struct ly_ht *, struct lyd_node **)"
                 );
  }
  LVar9 = lyd_validate_choice_r(first,sparent,mod,ext,val_opts,int_opts,getnext_ht,diff);
  if (((LVar9 == LY_SUCCESS) ||
      ((LVar10 = LVar9, LVar9 == LY_EVALID && (LVar10 = LY_EVALID, (val_opts & 4) != 0)))) &&
     (node = *first, LVar10 = LVar9, node != (lyd_node *)0x0)) {
    plVar14 = (lys_module *)0x0;
    do {
      while( true ) {
        if (node->schema == (lysc_node *)0x0) {
          return LVar9;
        }
        if ((mod != (lys_module *)0x0) && (plVar11 = lyd_owner_module(node), plVar11 != mod)) {
          return LVar9;
        }
        if ((node->flags & 5) == 0) break;
        plVar11 = (lys_module *)node->schema;
        uVar1 = *(uint16_t *)&plVar11->ctx;
        if (uVar1 == 1) {
          if (((ulong)plVar11->ctx & 0x800000) == 0) goto LAB_001b9704;
LAB_001b9710:
          bVar4 = true;
        }
        else {
          if (((uVar1 != 8) && (uVar1 != 4)) || (plVar11->deviated_by == (lys_module **)0x0))
          goto LAB_001b9710;
LAB_001b9704:
          bVar4 = false;
        }
        if ((((node->flags & 4) == 0) || (bVar4)) || (plVar11 == plVar14)) {
LAB_001b9975:
          if ((node->flags & 4) != 0) {
            plVar12 = (lysc_node *)*first;
            local_50 = (lysc_node *)node;
            if ((node->flags & 4) == 0) {
              __assert_fail("node->flags & LYD_NEW",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                            ,0x235,
                            "LY_ERR lyd_validate_duplicates(const struct lyd_node *, const struct lyd_node *, uint32_t)"
                           );
            }
            plVar2 = node->schema;
            if (plVar2 == (lysc_node *)0x0) {
LAB_001b99cc:
              if ((node->parent == (lyd_node_inner *)0x0) ||
                 (ht = node->parent->children_ht, ht == (ly_ht *)0x0)) {
                local_38 = 0;
                for (; plVar12 != (lysc_node *)0x0; plVar12 = plVar12->next) {
                  if (plVar12 != local_50) {
                    if (((ulong)local_50->module->ctx & 100) == 0) {
                      LVar10 = lyd_compare_single((lyd_node *)plVar12,(lyd_node *)local_50,0);
                      if (LVar10 == LY_SUCCESS) goto LAB_001b9a0d;
                    }
                    else if (plVar12->module == local_50->module) goto LAB_001b9a0d;
                  }
                }
              }
              else {
                local_38 = 0;
                LVar10 = lyht_find_next_with_collision_cb
                                   (ht,&local_50,node->hash,lyd_val_dup_val_equal,(void **)0x0);
                if (LVar10 == LY_SUCCESS) {
LAB_001b9a0d:
                  plVar6 = local_50->module->ctx;
                  ly_log_location((lysc_node *)0x0,(lyd_node *)local_50,(char *)0x0,(ly_in *)0x0);
                  ctx = ((lys_module *)local_50->module->name)->ctx;
                  local_3c = val_opts;
                  if (((val_opts & 8) == 0) || (((ulong)plVar6 & 0x18) == 0)) {
                    ly_vlog(ctx,(char *)0x0,LYVE_DATA,"Duplicate instance of \"%s\".");
                    local_38 = 7;
                  }
                  else {
                    local_38 = 0;
                    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Duplicate instance of \"%s\".");
                  }
                  ly_log_location_revert(0,1,0,0);
                  val_opts = local_3c;
                }
              }
            }
            else {
              if (plVar2->nodetype == 8) {
                if ((plVar2->flags & 1) != 0) goto LAB_001b99cc;
              }
              else if ((plVar2->nodetype != 0x10) || ((plVar2->flags & 0x200) == 0))
              goto LAB_001b99cc;
              local_38 = 0;
            }
            LVar10 = (LY_ERR)local_38;
            if (LVar10 != LY_SUCCESS) {
              if (LVar10 != LY_EVALID) {
                return LVar10;
              }
              LVar9 = LY_EVALID;
              if ((val_opts & 4) == 0) {
                return LY_EVALID;
              }
            }
            node->flags = node->flags & 0xfffffffb;
          }
          if ((node->flags & 1) != 0) {
            local_50 = (lysc_node *)0x0;
            if ((node->flags & 1) == 0) {
              __assert_fail("(*node)->flags & LYD_DEFAULT",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                            ,0x358,
                            "ly_bool lyd_validate_autodel_case_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                           );
            }
            plVar12 = node->schema;
            plVar2 = plVar12->parent;
            if ((plVar2 != (lysc_node *)0x0) && (plVar2->nodetype == 0x80)) {
              if (plVar2->parent->nodetype != 2) {
                __assert_fail("choic->nodetype == LYS_CHOICE",
                              "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                              ,0x362,
                              "ly_bool lyd_validate_autodel_case_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                             );
              }
              if (plVar2->parent[1].parent != plVar2) {
                last = (lyd_node *)0x0;
                do {
                  last = lys_getnext_data(last,*first,&local_50,plVar12->parent,(lysc_module *)0x0);
                  if (last == (lyd_node *)0x0) {
                    lVar7 = lyd_validate_autodel_node_del
                                      (first,node,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,diff);
                    if (lVar7 != '\0') goto joined_r0x001b9b92;
                    break;
                  }
                } while ((last->flags & 1) != 0);
              }
            }
          }
          node = node->next;
          goto joined_r0x001b9b92;
        }
        plVar14 = plVar11;
        if (uVar1 == 8) {
          if ((node->flags & 4) == 0) {
            __assert_fail("(*node)->flags & LYD_NEW",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                          ,0x2ee,
                          "ly_bool lyd_validate_autodel_leaflist_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                         );
          }
          if (*(uint16_t *)&plVar11->ctx != 8) {
            __assert_fail("schema->nodetype == LYS_LEAFLIST",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                          ,0x2f1,
                          "ly_bool lyd_validate_autodel_leaflist_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                         );
          }
          lyd_find_sibling_val(*first,(lysc_node *)plVar11,(char *)0x0,0,(lyd_node **)&local_50);
LAB_001b9763:
          if ((local_50 != (lysc_node *)0x0) && (local_50->module == plVar11)) {
            if ((*(uint32_t *)local_50->hash & 1) != 0) goto code_r0x001b9780;
            local_50 = (lysc_node *)0x0;
            plVar12 = (lysc_node *)0x0;
            local_3c = val_opts;
            lyd_find_sibling_val(*first,(lysc_node *)plVar11,(char *)0x0,0,(lyd_node **)&local_50);
            bVar5 = false;
            plVar2 = local_50;
            bVar4 = false;
            while( true ) {
              local_50 = plVar2;
              bVar3 = true;
              if ((local_50 != (lysc_node *)0x0) && (local_50->module == plVar11)) {
                plVar12 = local_50->next;
                bVar3 = false;
              }
              if (bVar3) break;
              plVar2 = plVar12;
              if ((*(uint32_t *)local_50->hash & 1) != 0) {
                lVar7 = lyd_validate_autodel_node_del
                                  (first,(lyd_node *)local_50,mod,0,&node,(ly_set *)0x0,
                                   (ly_set *)0x0,diff);
                bVar4 = bVar5;
                if (lVar7 != '\0') {
                  bVar5 = true;
                  bVar4 = true;
                }
              }
            }
            val_opts = local_3c;
            if (bVar4) goto LAB_001b995f;
          }
          goto LAB_001b9975;
        }
        if ((node->flags & 4) == 0) {
          __assert_fail("(*node)->flags & LYD_NEW",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                        ,0x31d,
                        "ly_bool lyd_validate_autodel_cont_leaf_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                       );
        }
        if (((ulong)plVar11->ctx & 5) == 0) {
          __assert_fail("schema->nodetype & (LYS_LEAF | LYS_CONTAINER)",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                        ,800,
                        "ly_bool lyd_validate_autodel_cont_leaf_dflt(struct lyd_node **, struct lyd_node **, const struct lys_module *, struct lyd_node **)"
                       );
        }
        lyd_find_sibling_val(*first,(lysc_node *)plVar11,(char *)0x0,0,(lyd_node **)&local_50);
LAB_001b97b9:
        if ((local_50 != (lysc_node *)0x0) && (local_50->module == plVar11)) {
          if ((*(uint32_t *)local_50->hash & 1) != 0) goto code_r0x001b97ce;
          local_50 = (lysc_node *)0x0;
          plVar12 = (lysc_node *)0x0;
          local_3c = val_opts;
          lyd_find_sibling_val(*first,(lysc_node *)plVar11,(char *)0x0,0,(lyd_node **)&local_50);
          lVar13 = '\0';
          lVar7 = '\0';
          plVar2 = local_50;
          while( true ) {
            local_50 = plVar2;
            bVar4 = true;
            if ((local_50 != (lysc_node *)0x0) && (local_50->module == plVar11)) {
              plVar12 = local_50->next;
              bVar4 = false;
            }
            val_opts = local_3c;
            if (bVar4) break;
            plVar2 = plVar12;
            if ((*(uint32_t *)local_50->hash & 1) != 0) {
              lVar8 = lyd_validate_autodel_node_del
                                (first,(lyd_node *)local_50,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,
                                 diff);
              lVar7 = lVar13;
              if (lVar8 != '\0') {
                lVar13 = '\x01';
                lVar7 = '\x01';
              }
            }
          }
          goto LAB_001b995a;
        }
        lVar7 = '\0';
        lyd_find_sibling_val(*first,(lysc_node *)plVar11,(char *)0x0,0,(lyd_node **)&local_50);
        if (local_50 != (lysc_node *)0x0) {
          do {
            if (local_50->module != plVar11) break;
            if ((*(uint *)local_50->hash & 5) == 1) {
              lVar7 = lyd_validate_autodel_node_del
                                (first,(lyd_node *)local_50,mod,0,&node,(ly_set *)0x0,(ly_set *)0x0,
                                 diff);
              goto LAB_001b995a;
            }
            local_50 = local_50->next;
          } while (local_50 != (lysc_node *)0x0);
          lVar7 = '\0';
        }
LAB_001b995a:
        if (lVar7 == '\0') goto LAB_001b9975;
LAB_001b995f:
        if (node == (lyd_node *)0x0) {
          return LVar9;
        }
      }
      node = node->next;
joined_r0x001b9b92:
      LVar10 = LVar9;
    } while (node != (lyd_node *)0x0);
  }
  return LVar10;
code_r0x001b9780:
  local_50 = local_50->next;
  goto LAB_001b9763;
code_r0x001b97ce:
  local_50 = local_50->next;
  goto LAB_001b97b9;
}

Assistant:

LY_ERR
lyd_validate_new(struct lyd_node **first, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_ext_instance *ext, uint32_t val_opts, uint32_t int_opts, struct ly_ht *getnext_ht,
        struct lyd_node **diff)
{
    LY_ERR r, rc = LY_SUCCESS;
    struct lyd_node *node;
    const struct lysc_node *last_dflt_schema = NULL;

    assert(first && (sparent || mod));

    /* validate choices */
    r = lyd_validate_choice_r(first, sparent, mod, ext, val_opts, int_opts, getnext_ht, diff);
    LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

    node = *first;
    while (node) {
        if (!node->schema || (mod && (lyd_owner_module(node) != mod))) {
            /* opaque node or all top-level data from this module checked */
            break;
        }

        if (!(node->flags & (LYD_NEW | LYD_DEFAULT))) {
            /* check only new and default nodes */
            node = node->next;
            continue;
        }

        if (lyd_val_has_default(node->schema) && (node->schema != last_dflt_schema) && (node->flags & LYD_NEW)) {
            /* remove old default(s) of the new node if an explicit instance exists */
            last_dflt_schema = node->schema;
            if (node->schema->nodetype == LYS_LEAFLIST) {
                if (lyd_validate_autodel_leaflist_dflt(first, &node, mod, diff)) {
                    continue;
                }
            } else {
                if (lyd_validate_autodel_cont_leaf_dflt(first, &node, mod, diff)) {
                    continue;
                }
            }
        }

        if (node->flags & LYD_NEW) {
            /* then check new node instance duplicities */
            r = lyd_validate_duplicates(*first, node, val_opts);
            LY_VAL_ERR_GOTO(r, rc = r, val_opts, cleanup);

            /* this node is valid */
            node->flags &= ~LYD_NEW;
        }

        if (node->flags & LYD_DEFAULT) {
            /* remove leftover default nodes from a no-longer existing case */
            if (lyd_validate_autodel_case_dflt(first, &node, mod, diff)) {
                continue;
            }
        }

        /* next iter */
        node = node->next;
    }

cleanup:
    return rc;
}